

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O0

void __thiscall Assimp::FBX::FBXExportProperty::FBXExportProperty(FBXExportProperty *this,bool v)

{
  allocator<unsigned_char> local_13;
  value_type_conflict5 local_12;
  undefined1 local_11;
  FBXExportProperty *pFStack_10;
  bool v_local;
  FBXExportProperty *this_local;
  
  this->type = 'C';
  local_12 = v;
  local_11 = v;
  pFStack_10 = this;
  std::allocator<unsigned_char>::allocator(&local_13);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->data,1,&local_12,&local_13);
  std::allocator<unsigned_char>::~allocator(&local_13);
  return;
}

Assistant:

FBXExportProperty::FBXExportProperty(bool v)
: type('C')
, data(1, uint8_t(v)) {}